

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.h
# Opt level: O3

void __thiscall draco::AttributesEncoder::AddAttributeId(AttributesEncoder *this,int32_t id)

{
  iterator __position;
  undefined8 in_RAX;
  pointer piVar1;
  int local_18;
  value_type_conflict1 local_14;
  
  _local_18 = CONCAT44((value_type_conflict1)((ulong)in_RAX >> 0x20),id);
  __position._M_current =
       (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->point_attribute_ids_,__position,&local_18);
    id = local_18;
  }
  else {
    *__position._M_current = id;
    (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  piVar1 = (this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->point_attribute_to_local_id_map_).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1) >> 2) <= id) {
    _local_18 = CONCAT44(0xffffffff,local_18);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->point_attribute_to_local_id_map_,(long)(id + 1),&local_14);
    piVar1 = (this->point_attribute_to_local_id_map_).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    id = local_18;
  }
  piVar1[id] = (int)((ulong)((long)(this->point_attribute_ids_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->point_attribute_ids_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2) + -1;
  return;
}

Assistant:

void AddAttributeId(int32_t id) {
    point_attribute_ids_.push_back(id);
    if (id >= static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(id + 1, -1);
    }
    point_attribute_to_local_id_map_[id] =
        static_cast<int32_t>(point_attribute_ids_.size()) - 1;
  }